

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O2

void duckdb::ScalarSubqueryErrorOnMultipleRowsSetting::ResetLocal(ClientContext *context)

{
  ClientConfig *pCVar1;
  ClientConfig local_200;
  
  switchD_014c3389::default(&local_200,0,0x1e8);
  ClientConfig::ClientConfig(&local_200);
  pCVar1 = ClientConfig::GetConfig(context);
  pCVar1->scalar_subquery_error_on_multiple_rows = local_200.scalar_subquery_error_on_multiple_rows;
  ClientConfig::~ClientConfig(&local_200);
  return;
}

Assistant:

void ScalarSubqueryErrorOnMultipleRowsSetting::ResetLocal(ClientContext &context) {
	ClientConfig::GetConfig(context).scalar_subquery_error_on_multiple_rows =
	    ClientConfig().scalar_subquery_error_on_multiple_rows;
}